

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

void __thiscall HyperGraph::init_hypergraph(HyperGraph *this)

{
  uint uVar1;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *this_00;
  bool bVar2;
  size_type sVar3;
  allocator<unsigned_int> local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  allocator<bool> local_89;
  vector<bool,_std::allocator<bool>_> local_88;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_49;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  reference local_30;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  const_iterator __end1;
  const_iterator __begin1;
  Graph *__range1;
  HyperGraph *this_local;
  
  sVar3 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size(this->_graph);
  this->__numV = (uint32_t)sVar3;
  this_00 = this->_graph;
  __end1 = std::
           vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           ::begin(this_00);
  nbrs = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
         )std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                *)&nbrs);
    if (!bVar2) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
               ::operator*(&__end1);
    sVar3 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(local_30);
    this->__numE = sVar3 + this->__numE;
    __gnu_cxx::
    __normal_iterator<const_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar1 = this->__numV;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(&local_49);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_48,(ulong)uVar1,&local_49);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=(&this->_FRsets,&local_48);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_48);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator(&local_49)
  ;
  uVar1 = this->__numV;
  std::allocator<bool>::allocator(&local_89);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_88,(ulong)uVar1,&local_89);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->__vecVisitBool,&local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_88);
  std::allocator<bool>::~allocator(&local_89);
  uVar1 = this->__numV;
  std::allocator<unsigned_int>::allocator(&local_a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,(ulong)uVar1,&local_a9)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__vecVisitNode,&local_a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
  std::allocator<unsigned_int>::~allocator(&local_a9);
  return;
}

Assistant:

void init_hypergraph()
    {
        __numV = (uint32_t)_graph.size();
        for (auto& nbrs : _graph) __numE += nbrs.size();
        _FRsets = FRsets(__numV);
        __vecVisitBool = std::vector<bool>(__numV);
        __vecVisitNode = Nodelist(__numV);
    }